

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

bool walkModelAndPipeline
               (Model *model,function<bool_(const_CoreML::Specification::Model_&)> *handler)

{
  uint32_t uVar1;
  int iVar2;
  Rep *pRVar3;
  Model *pMVar4;
  bool bVar5;
  undefined1 *puVar6;
  undefined8 uVar7;
  void **ppvVar8;
  InternalMetadata *pIVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  _Any_data local_90;
  code *local_80;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  uVar1 = model->_oneof_case_[0];
  if (uVar1 == 200) {
    if (uVar1 == 200) {
      puVar6 = (undefined1 *)(model->Type_).pipelineclassifier_;
    }
    else {
      puVar6 = CoreML::Specification::_PipelineClassifier_default_instance_;
    }
    puVar6 = (undefined1 *)((PipelineClassifier *)puVar6)->pipeline_;
    if ((Pipeline *)puVar6 == (Pipeline *)0x0) {
      puVar6 = CoreML::Specification::_Pipeline_default_instance_;
    }
    pRVar3 = (((Pipeline *)puVar6)->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar8 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar8 = (void **)0x0;
    }
    lVar11 = (long)(((Pipeline *)puVar6)->models_).super_RepeatedPtrFieldBase.current_size_;
    bVar12 = lVar11 == 0;
    if (!bVar12) {
      lVar10 = 0;
      do {
        pMVar4 = *(Model **)((long)ppvVar8 + lVar10);
        std::function<bool_(const_CoreML::Specification::Model_&)>::function
                  ((function<bool_(const_CoreML::Specification::Model_&)> *)&local_90,handler);
        bVar5 = walkModelAndPipeline
                          (pMVar4,(function<bool_(const_CoreML::Specification::Model_&)> *)&local_90
                          );
        if (local_80 != (code *)0x0) {
          (*local_80)(&local_90,&local_90,__destroy_functor);
        }
        if (bVar5) goto LAB_002f1b6c;
        lVar10 = lVar10 + 8;
        bVar12 = lVar11 * 8 == lVar10;
      } while (!bVar12);
    }
  }
  else if (uVar1 == 0xc9) {
    if (uVar1 == 0xc9) {
      puVar6 = (undefined1 *)(model->Type_).pipelineclassifier_;
    }
    else {
      puVar6 = CoreML::Specification::_PipelineRegressor_default_instance_;
    }
    puVar6 = (undefined1 *)((PipelineClassifier *)puVar6)->pipeline_;
    if ((Pipeline *)puVar6 == (Pipeline *)0x0) {
      puVar6 = CoreML::Specification::_Pipeline_default_instance_;
    }
    pRVar3 = (((Pipeline *)puVar6)->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar8 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar8 = (void **)0x0;
    }
    lVar11 = (long)(((Pipeline *)puVar6)->models_).super_RepeatedPtrFieldBase.current_size_;
    bVar12 = lVar11 == 0;
    if (!bVar12) {
      lVar10 = 0;
      do {
        pMVar4 = *(Model **)((long)ppvVar8 + lVar10);
        std::function<bool_(const_CoreML::Specification::Model_&)>::function
                  ((function<bool_(const_CoreML::Specification::Model_&)> *)&local_70,handler);
        bVar5 = walkModelAndPipeline
                          (pMVar4,(function<bool_(const_CoreML::Specification::Model_&)> *)&local_70
                          );
        if (local_60 != (code *)0x0) {
          (*local_60)(&local_70,&local_70,__destroy_functor);
        }
        if (bVar5) goto LAB_002f1b6c;
        lVar10 = lVar10 + 8;
        bVar12 = lVar11 * 8 == lVar10;
      } while (!bVar12);
    }
  }
  else if (uVar1 == 0xca) {
    if (uVar1 != 0xca) {
      puVar6 = CoreML::Specification::_Pipeline_default_instance_;
    }
    else {
      puVar6 = (undefined1 *)(model->Type_).treeensembleclassifier_;
    }
    pIVar9 = &(((((TreeEnsembleClassifier *)puVar6)->ClassLabels_).stringclasslabels_)->
              super_MessageLite)._internal_metadata_;
    if ((((TreeEnsembleClassifier *)puVar6)->ClassLabels_).stringclasslabels_ == (StringVector *)0x0
       ) {
      pIVar9 = (InternalMetadata *)0x0;
    }
    iVar2 = ((TreeEnsembleClassifier *)puVar6)->postevaluationtransform_;
    bVar12 = (long)iVar2 == 0;
    if (!bVar12) {
      lVar11 = 0;
      do {
        pMVar4 = *(Model **)((long)&pIVar9->ptr_ + lVar11);
        std::function<bool_(const_CoreML::Specification::Model_&)>::function
                  ((function<bool_(const_CoreML::Specification::Model_&)> *)&local_50,handler);
        bVar5 = walkModelAndPipeline
                          (pMVar4,(function<bool_(const_CoreML::Specification::Model_&)> *)&local_50
                          );
        if (local_40 != (code *)0x0) {
          (*local_40)(&local_50,&local_50,__destroy_functor);
        }
        if (bVar5) goto LAB_002f1b6c;
        lVar11 = lVar11 + 8;
        bVar12 = (long)iVar2 * 8 == lVar11;
      } while (!bVar12);
    }
  }
LAB_002f1b77:
  if ((handler->super__Function_base)._M_manager != (_Manager_type)0x0) {
    bVar12 = (*handler->_M_invoker)((_Any_data *)handler,model);
    return bVar12;
  }
  uVar7 = std::__throw_bad_function_call();
  __clang_call_terminate(uVar7);
LAB_002f1b6c:
  if (!bVar12) {
    return true;
  }
  goto LAB_002f1b77;
}

Assistant:

static bool walkModelAndPipeline(const Specification::Model &model,
                                 std::function<bool(const Specification::Model& m)> handler) {
    switch (model.Type_case()) {
        case Specification::Model::kPipeline:
            for (auto &m : model.pipeline().models()) {
                if (walkModelAndPipeline(m, handler)) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineRegressor:
            for (auto &m : model.pipelineregressor().pipeline().models()) {
                if (walkModelAndPipeline(m, handler)) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineClassifier:
            for (auto &m : model.pipelineclassifier().pipeline().models()) {
                if (walkModelAndPipeline(m, handler)) {
                    return true;
                }
            }
            break;
        default:
            break;
    }
    if (handler(model)) {
        return true;
    }
    return false;
}